

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

void __thiscall antlr::ASTFactory::addASTChild(ASTFactory *this,ASTPair *currentAST,RefAST *child)

{
  ASTRef *pAVar1;
  ASTRef *pAVar2;
  AST *pAVar3;
  AST *pAVar4;
  ASTRefCount<antlr::AST> *this_00;
  ASTRefCount<antlr::AST> local_28;
  ASTRefCount<antlr::AST> local_20;
  
  this_00 = &local_28;
  pAVar1 = child->ref;
  if ((pAVar1 != (ASTRef *)0x0) && (pAVar1->ptr != (AST *)0x0)) {
    pAVar2 = (currentAST->root).ref;
    if ((pAVar2 == (ASTRef *)0x0) || (pAVar3 = pAVar2->ptr, pAVar3 == (AST *)0x0)) {
      ASTRefCount<antlr::AST>::operator=(&currentAST->root,child);
    }
    else {
      pAVar2 = (currentAST->child).ref;
      if ((pAVar2 == (ASTRef *)0x0) || (pAVar4 = pAVar2->ptr, pAVar4 == (AST *)0x0)) {
        pAVar1->count = pAVar1->count + 1;
        local_20.ref = pAVar1;
        (*pAVar3->_vptr_AST[0x14])(pAVar3,&local_20);
        this_00 = &local_20;
      }
      else {
        pAVar1->count = pAVar1->count + 1;
        local_28.ref = pAVar1;
        (*pAVar4->_vptr_AST[0x15])(pAVar4,&local_28);
      }
      ASTRefCount<antlr::AST>::~ASTRefCount(this_00);
    }
    ASTRefCount<antlr::AST>::operator=(&currentAST->child,child);
    ASTPair::advanceChildToEnd(currentAST);
  }
  return;
}

Assistant:

void ASTFactory::setMaxNodeType( int type )
{
	if( nodeFactories.size() < (static_cast<unsigned int>(type)+1) )
		nodeFactories.resize( type+1, &default_factory_descriptor );
}